

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer this_00;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *this_01;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> local_20;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileUtilityTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_011098f0;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&>((cmGeneratorTarget **)&local_20);
  this_01 = &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator;
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::operator=
            (this_01,&local_20);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            (&local_20);
  this_00 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(this_01);
  cmOSXBundleGenerator::SetMacContentFolders
            (this_00,&(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}